

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O1

int fits_delete_iraf_file(char *filename,int *status)

{
  int iVar1;
  char *irafheader;
  char *__s1;
  char *pcVar2;
  char *pcVar3;
  int nc;
  int lenirafhead;
  char pixfilename [256];
  int local_12c;
  char local_128 [256];
  
  irafheader = irafrdhead(filename,&local_12c);
  if (irafheader == (char *)0x0) {
    *status = 0x68;
    return 0x68;
  }
  iVar1 = head_version(irafheader);
  if (iVar1 == 2) {
    __s1 = irafgetc(irafheader,0x7e,0xff);
  }
  else {
    if (iVar1 == 0) {
      ffpmsg("File not valid IRAF image header");
      ffpmsg(filename);
      *status = 0x68;
      goto LAB_001968c6;
    }
    __s1 = irafgetc2(irafheader,0x19c,nc);
  }
  iVar1 = strncmp(__s1,"HDR",3);
  if ((iVar1 == 0) && (pcVar2 = same_path(__s1,filename), pcVar2 != (char *)0x0)) {
    free(__s1);
    __s1 = pcVar2;
  }
  pcVar2 = strchr(__s1,0x2f);
  if (((pcVar2 == (char *)0x0) && (pcVar2 = strchr(__s1,0x24), pcVar2 == (char *)0x0)) &&
     (pcVar2 = same_path(__s1,filename), pcVar2 != (char *)0x0)) {
    free(__s1);
    __s1 = pcVar2;
  }
  pcVar3 = strchr(__s1,0x21);
  pcVar2 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar2 = __s1;
  }
  strcpy(local_128,pcVar2);
  free(__s1);
LAB_001968c6:
  free(irafheader);
  iVar1 = *status;
  if (iVar1 < 1) {
    remove(filename);
    remove(local_128);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int fits_delete_iraf_file(const char *filename,  /* name of input file      */
             int *status)                        /* IO - error status       */

/*
   Delete the iraf .imh header file and the associated .pix data file
*/
{
    char *irafheader;
    int lenirafhead;

    char pixfilename[SZ_IM2PIXFILE+1];

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    getirafpixname (filename, irafheader, pixfilename, status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    remove(filename);
    remove(pixfilename);
    
    return(*status);
}